

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  wally_tx_witness_stack *pwVar1;
  uchar *puVar2;
  wally_tx_output *pwVar3;
  wally_tx_witness_item *pwVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  CfdException *pCVar13;
  size_t *psVar14;
  undefined7 in_register_00000011;
  byte bVar15;
  size_t max_size;
  ulong uVar16;
  ulong uVar17;
  uint32_t flags;
  size_type sVar18;
  uint uVar19;
  ulong uVar20;
  uint8_t *result;
  uint8_t *puVar21;
  uint64_t uVar22;
  uint8_t *buffer_addr;
  long lVar23;
  wally_tx *pwVar24;
  byte bVar25;
  wally_tx_input *pwVar26;
  int ret;
  size_t size;
  size_t txsize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_type local_a8;
  bool local_9d;
  int local_9c;
  wally_tx *local_98;
  pointer local_90;
  size_t *local_88;
  undefined1 local_80 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ulong local_48;
  ByteData *local_40;
  ulong local_38;
  
  local_98 = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_90 = (pointer)0x0;
  flags = (uint32_t)CONCAT71(in_register_00000011,has_witness);
  local_9d = has_witness;
  local_9c = wally_tx_get_length(local_98,flags,(size_t *)&local_90);
  if (local_9c != 0) {
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xe7b;
    local_80._16_8_ = "GetByteData";
    logger::log<int&,bool&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
               "wally_tx_get_length NG[{}]. wit[{}]",&local_9c,&local_9d);
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tx length calc error.","")
    ;
    CfdException::CfdException(pCVar13,kCfdIllegalStateError,(string *)local_80);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_9c = 0;
  if (local_90 < (pointer)0xb) {
    local_9c = -2;
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xe82;
    local_80._16_8_ = "GetByteData";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"tx size low.[{}]",
               (unsigned_long *)&local_90);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_60,(size_type)local_90,(allocator_type *)local_80);
  if (local_9c != -2) {
    local_80._0_8_ = local_90;
    local_9c = wally_tx_to_bytes(local_98,flags,
                                 local_60.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_80)
    ;
    if (local_9c == 0) goto LAB_004c0e6a;
    if (local_9c != -2) {
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0xf6c;
      local_80._16_8_ = "GetByteData";
      logger::log<int&>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
                        "wally_tx_to_bytes NG[{}].",&local_9c);
      pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
      local_80._0_8_ = local_80 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"tx hex convert error.","");
      CfdException::CfdException(pCVar13,kCfdIllegalStateError,(string *)local_80);
      __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pwVar24 = local_98;
  local_88 = &local_98->num_inputs;
  if ((local_98->num_inputs != 0) && (local_98->num_outputs != 0)) {
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xf67;
    local_80._16_8_ = "GetByteData";
    logger::log<int&,unsigned_long&,unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
               "wally_tx_to_bytes NG[{}]. in/out={}/{}",&local_9c,local_88,&local_98->num_outputs);
    pCVar13 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tx hex convert error.","")
    ;
    CfdException::CfdException(pCVar13,kCfdIllegalStateError,(string *)local_80);
    __cxa_throw(pCVar13,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_80._0_8_ = "cfdcore_elements_transaction.cpp";
  local_80._8_4_ = 0xe92;
  local_80._16_8_ = "GetByteData";
  logger::log<unsigned_long&>
            ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
             (unsigned_long *)&local_90);
  uVar12 = pwVar24->num_inputs;
  uVar11 = pwVar24->num_outputs;
  local_a8 = uVar12 * 0xd0 + uVar11 * 0x70 + 0x38;
  if (uVar12 != 0) {
    psVar14 = &pwVar24->inputs->inflation_keys_len;
    uVar16 = 1;
    do {
      sVar18 = local_a8 + 0x40;
      if ((uchar *)psVar14[-3] != (uchar *)0x0) {
        sVar18 = psVar14[-2] + local_a8 + 0x4a;
      }
      local_a8 = sVar18;
      if ((uchar *)psVar14[-1] != (uchar *)0x0) {
        local_a8 = sVar18 + *psVar14 + 10;
      }
      psVar14 = psVar14 + 0x1a;
      bVar5 = uVar16 < uVar12;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar5);
  }
  if (uVar11 != 0) {
    psVar14 = &pwVar24->outputs->nonce_len;
    uVar16 = 1;
    do {
      if ((uchar *)psVar14[-5] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar14[-4] + 10;
      }
      if ((uchar *)psVar14[-3] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar14[-2] + 10;
      }
      if ((uchar *)psVar14[-1] != (uchar *)0x0) {
        local_a8 = local_a8 + *psVar14 + 10;
      }
      if ((uchar *)psVar14[-8] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar14[-7] + 10;
      }
      local_a8 = local_a8 + 10;
      psVar14 = psVar14 + 0xe;
      bVar5 = uVar16 < uVar11;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (bVar5);
  }
  uVar16 = 0;
  if (uVar12 == 0) {
    bVar25 = 0;
  }
  else {
    pwVar26 = pwVar24->inputs;
    bVar25 = 0;
    uVar17 = 0;
    do {
      if (pwVar26[uVar16].issuance_amount_rangeproof != (uchar *)0x0) {
        local_a8 = local_a8 + pwVar26[uVar16].issuance_amount_rangeproof_len + 10;
        uVar17 = CONCAT71((int7)(pwVar26[uVar16].issuance_amount_rangeproof_len >> 8),1);
      }
      if (pwVar26[uVar16].inflation_keys_rangeproof != (uchar *)0x0) {
        local_a8 = local_a8 + pwVar26[uVar16].inflation_keys_rangeproof_len + 10;
        uVar17 = CONCAT71((int7)(pwVar26[uVar16].inflation_keys_rangeproof_len >> 8),1);
      }
      pwVar1 = pwVar26[uVar16].witness;
      if ((pwVar1 != (wally_tx_witness_stack *)0x0) && (pwVar1->num_items != 0)) {
        psVar14 = &pwVar1->items->witness_len;
        uVar20 = 1;
        do {
          local_a8 = local_a8 + *psVar14 + 10;
          psVar14 = psVar14 + 2;
          bVar5 = uVar20 < pwVar1->num_items;
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (bVar5);
        bVar25 = 1;
      }
      pwVar1 = pwVar26[uVar16].pegin_witness;
      if ((pwVar1 != (wally_tx_witness_stack *)0x0) && (pwVar1->num_items != 0)) {
        psVar14 = &pwVar1->items->witness_len;
        uVar19 = 1;
        do {
          local_a8 = local_a8 + *psVar14 + 10;
          uVar20 = (ulong)uVar19;
          psVar14 = psVar14 + 2;
          uVar19 = uVar19 + 1;
        } while (uVar20 < pwVar1->num_items);
        bVar25 = 1;
      }
      local_a8 = local_a8 + 10;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while (uVar16 < uVar12);
    bVar25 = bVar25 | (byte)uVar17;
    uVar16 = uVar17 & 0xffffffff;
  }
  if (uVar11 == 0) {
    bVar15 = 0;
  }
  else {
    psVar14 = &pwVar24->outputs->rangeproof_len;
    uVar19 = 1;
    bVar15 = 0;
    do {
      if ((uchar *)psVar14[-3] != (uchar *)0x0) {
        local_a8 = local_a8 + psVar14[-2] + 10;
        bVar15 = 1;
      }
      if ((uchar *)psVar14[-1] != (uchar *)0x0) {
        local_a8 = local_a8 + *psVar14 + 10;
        bVar15 = 1;
      }
      local_a8 = local_a8 + 10;
      uVar12 = (ulong)uVar19;
      psVar14 = psVar14 + 0xe;
      uVar19 = uVar19 + 1;
    } while (uVar12 < uVar11);
  }
  if ((ulong)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) < local_a8) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_60,local_a8);
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xedb;
    local_80._16_8_ = "GetByteData";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"buffer.resize[{}]",&local_a8);
  }
  *(uint32_t *)
   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = pwVar24->version;
  bVar25 = (bVar25 | bVar15) & (pwVar24->version >> 0x1e & 1) == 0;
  local_38 = (ulong)bVar25;
  *(byte *)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + 4) = bVar25;
  puVar9 = (uint32_t *)
           AbstractTransaction::CopyVariableInt
                     (pwVar24->num_inputs,
                      (uint8_t *)
                      ((long)local_60.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + 5));
  local_40 = __return_storage_ptr__;
  if (*local_88 != 0) {
    uVar12 = 0;
    uVar11 = 1;
    local_48 = uVar16;
    do {
      pwVar26 = pwVar24->inputs;
      uVar19 = pwVar26[uVar12].index;
      if ((pwVar26[uVar12].pegin_witness != (wally_tx_witness_stack *)0x0) &&
         ((pwVar26[uVar12].pegin_witness)->num_items != 0)) {
        uVar19 = uVar19 | 0x40000000;
      }
      pwVar26 = pwVar26 + uVar12;
      if ((pwVar26->issuance_amount != (uchar *)0x0) && (pwVar26->issuance_amount_len != 0)) {
        uVar19 = uVar19 | 0x80000000;
      }
      uVar6 = *(undefined8 *)pwVar26->txhash;
      uVar7 = *(undefined8 *)(pwVar26->txhash + 8);
      uVar8 = *(undefined8 *)(pwVar26->txhash + 0x18);
      *(undefined8 *)(puVar9 + 4) = *(undefined8 *)(pwVar26->txhash + 0x10);
      *(undefined8 *)(puVar9 + 6) = uVar8;
      *(undefined8 *)puVar9 = uVar6;
      *(undefined8 *)(puVar9 + 2) = uVar7;
      puVar9[8] = uVar19;
      puVar10 = (uint32_t *)
                AbstractTransaction::CopyVariableBuffer
                          (pwVar26->script,pwVar26->script_len,(uint8_t *)(puVar9 + 9));
      *puVar10 = pwVar26->sequence;
      puVar9 = puVar10 + 1;
      if ((uVar16 & 1) != 0) {
        uVar6 = *(undefined8 *)pwVar26->blinding_nonce;
        uVar7 = *(undefined8 *)(pwVar26->blinding_nonce + 8);
        uVar8 = *(undefined8 *)(pwVar26->blinding_nonce + 0x18);
        *(undefined8 *)(puVar10 + 5) = *(undefined8 *)(pwVar26->blinding_nonce + 0x10);
        *(undefined8 *)(puVar10 + 7) = uVar8;
        *(undefined8 *)puVar9 = uVar6;
        *(undefined8 *)(puVar10 + 3) = uVar7;
        uVar6 = *(undefined8 *)pwVar26->entropy;
        uVar7 = *(undefined8 *)(pwVar26->entropy + 8);
        uVar8 = *(undefined8 *)(pwVar26->entropy + 0x18);
        *(undefined8 *)(puVar10 + 0xd) = *(undefined8 *)(pwVar26->entropy + 0x10);
        *(undefined8 *)(puVar10 + 0xf) = uVar8;
        *(undefined8 *)(puVar10 + 9) = uVar6;
        *(undefined8 *)(puVar10 + 0xb) = uVar7;
        puVar10 = puVar10 + 0x11;
        puVar2 = pwVar26->issuance_amount;
        uVar12 = pwVar26->issuance_amount_len;
        if (uVar12 == 0 || puVar2 == (uchar *)0x0) {
LAB_004c0a7c:
          *(uint8_t *)puVar10 = '\0';
          uVar16 = 1;
        }
        else {
          if (*puVar2 == '\x01') {
            uVar16 = 9;
          }
          else {
            uVar16 = 0x21;
            if (*puVar2 == '\0') goto LAB_004c0a7c;
          }
          memset(puVar10,0,uVar16);
          if (uVar16 < uVar12) {
            uVar12 = uVar16;
          }
          memcpy(puVar10,puVar2,uVar12);
        }
        puVar21 = (uint8_t *)((long)puVar10 + uVar16);
        puVar2 = pwVar26->inflation_keys;
        uVar12 = pwVar26->inflation_keys_len;
        if (uVar12 == 0 || puVar2 == (uchar *)0x0) {
LAB_004c0ae3:
          *puVar21 = '\0';
          uVar16 = 1;
        }
        else {
          if (*puVar2 == '\x01') {
            uVar16 = 9;
          }
          else {
            uVar16 = 0x21;
            if (*puVar2 == '\0') goto LAB_004c0ae3;
          }
          memset(puVar21,0,uVar16);
          if (uVar16 < uVar12) {
            uVar12 = uVar16;
          }
          memcpy(puVar21,puVar2,uVar12);
        }
        puVar9 = (uint32_t *)(puVar21 + uVar16);
        uVar16 = local_48;
        pwVar24 = local_98;
      }
      bVar5 = uVar11 < *local_88;
      uVar12 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar5);
  }
  puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(pwVar24->num_outputs,(uint8_t *)puVar9);
  if (pwVar24->num_outputs != 0) {
    uVar12 = 0;
    uVar11 = 1;
    do {
      pwVar3 = pwVar24->outputs;
      puVar2 = pwVar3[uVar12].asset;
      uVar16 = pwVar3[uVar12].asset_len;
      if ((uVar16 == 0 || puVar2 == (uchar *)0x0) || (*puVar2 == '\0')) {
        *(uint8_t *)puVar9 = '\0';
        lVar23 = 1;
      }
      else {
        puVar9[4] = 0;
        puVar9[5] = 0;
        puVar9[6] = 0;
        puVar9[7] = 0;
        puVar9[0] = 0;
        puVar9[1] = 0;
        puVar9[2] = 0;
        puVar9[3] = 0;
        *(uint8_t *)(puVar9 + 8) = '\0';
        lVar23 = 0x21;
        if (0x20 < uVar16) {
          uVar16 = 0x21;
        }
        memcpy(puVar9,puVar2,uVar16);
      }
      puVar21 = (uint8_t *)((long)puVar9 + lVar23);
      puVar2 = pwVar3[uVar12].value;
      uVar16 = pwVar3[uVar12].value_len;
      if (uVar16 == 0 || puVar2 == (uchar *)0x0) {
LAB_004c0beb:
        *puVar21 = '\0';
        uVar17 = 1;
      }
      else {
        if (*puVar2 == '\x01') {
          uVar17 = 9;
        }
        else {
          uVar17 = 0x21;
          if (*puVar2 == '\0') goto LAB_004c0beb;
        }
        memset(puVar21,0,uVar17);
        if (uVar17 < uVar16) {
          uVar16 = uVar17;
        }
        memcpy(puVar21,puVar2,uVar16);
      }
      pwVar24 = local_98;
      puVar21 = puVar21 + uVar17;
      puVar2 = pwVar3[uVar12].nonce;
      uVar16 = pwVar3[uVar12].nonce_len;
      if ((uVar16 == 0 || puVar2 == (uchar *)0x0) || (*puVar2 == '\0')) {
        *puVar21 = '\0';
        lVar23 = 1;
      }
      else {
        puVar21[0x10] = '\0';
        puVar21[0x11] = '\0';
        puVar21[0x12] = '\0';
        puVar21[0x13] = '\0';
        puVar21[0x14] = '\0';
        puVar21[0x15] = '\0';
        puVar21[0x16] = '\0';
        puVar21[0x17] = '\0';
        puVar21[0x18] = '\0';
        puVar21[0x19] = '\0';
        puVar21[0x1a] = '\0';
        puVar21[0x1b] = '\0';
        puVar21[0x1c] = '\0';
        puVar21[0x1d] = '\0';
        puVar21[0x1e] = '\0';
        puVar21[0x1f] = '\0';
        puVar21[0] = '\0';
        puVar21[1] = '\0';
        puVar21[2] = '\0';
        puVar21[3] = '\0';
        puVar21[4] = '\0';
        puVar21[5] = '\0';
        puVar21[6] = '\0';
        puVar21[7] = '\0';
        puVar21[8] = '\0';
        puVar21[9] = '\0';
        puVar21[10] = '\0';
        puVar21[0xb] = '\0';
        puVar21[0xc] = '\0';
        puVar21[0xd] = '\0';
        puVar21[0xe] = '\0';
        puVar21[0xf] = '\0';
        puVar21[0x20] = '\0';
        lVar23 = 0x21;
        if (0x20 < uVar16) {
          uVar16 = 0x21;
        }
        memcpy(puVar21,puVar2,uVar16);
      }
      puVar9 = (uint32_t *)
               AbstractTransaction::CopyVariableBuffer
                         (pwVar3[uVar12].script,pwVar3[uVar12].script_len,puVar21 + lVar23);
      bVar5 = uVar11 < pwVar24->num_outputs;
      uVar12 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar5);
  }
  *puVar9 = pwVar24->locktime;
  puVar9 = puVar9 + 1;
  if ((char)local_38 != '\0') {
    if (*local_88 != 0) {
      uVar12 = 0;
      do {
        pwVar26 = pwVar24->inputs;
        puVar21 = AbstractTransaction::CopyVariableBuffer
                            (pwVar26[uVar12].issuance_amount_rangeproof,
                             pwVar26[uVar12].issuance_amount_rangeproof_len,(uint8_t *)puVar9);
        puVar21 = AbstractTransaction::CopyVariableBuffer
                            (pwVar26[uVar12].inflation_keys_rangeproof,
                             pwVar26[uVar12].inflation_keys_rangeproof_len,puVar21);
        if (pwVar26[uVar12].witness == (wally_tx_witness_stack *)0x0) {
          uVar22 = 0;
        }
        else {
          uVar22 = (pwVar26[uVar12].witness)->num_items;
        }
        puVar21 = AbstractTransaction::CopyVariableInt(uVar22,puVar21);
        if (uVar22 != 0) {
          uVar11 = 0;
          uVar16 = 1;
          do {
            pwVar4 = (pwVar26[uVar12].witness)->items;
            puVar21 = AbstractTransaction::CopyVariableBuffer
                                (pwVar4[uVar11].witness,pwVar4[uVar11].witness_len,puVar21);
            bVar5 = uVar16 < uVar22;
            uVar11 = uVar16;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar5);
        }
        if (pwVar26[uVar12].pegin_witness == (wally_tx_witness_stack *)0x0) {
          uVar22 = 0;
        }
        else {
          uVar22 = (pwVar26[uVar12].pegin_witness)->num_items;
        }
        puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(uVar22,puVar21);
        if (uVar22 != 0) {
          uVar11 = 0;
          uVar16 = 1;
          do {
            pwVar4 = (pwVar26[uVar12].pegin_witness)->items;
            puVar9 = (uint32_t *)
                     AbstractTransaction::CopyVariableBuffer
                               (pwVar4[uVar11].witness,pwVar4[uVar11].witness_len,(uint8_t *)puVar9)
            ;
            bVar5 = uVar16 < uVar22;
            uVar11 = uVar16;
            uVar16 = (ulong)((int)uVar16 + 1);
          } while (bVar5);
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pwVar24 = local_98;
      } while (uVar12 < *local_88);
    }
    if (pwVar24->num_outputs != 0) {
      uVar12 = 0;
      uVar11 = 1;
      do {
        pwVar3 = pwVar24->outputs;
        puVar21 = AbstractTransaction::CopyVariableBuffer
                            (pwVar3[uVar12].surjectionproof,pwVar3[uVar12].surjectionproof_len,
                             (uint8_t *)puVar9);
        puVar9 = (uint32_t *)
                 AbstractTransaction::CopyVariableBuffer
                           (pwVar3[uVar12].rangeproof,pwVar3[uVar12].rangeproof_len,puVar21);
        bVar5 = uVar11 < pwVar24->num_outputs;
        uVar12 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5);
    }
  }
  __return_storage_ptr__ = local_40;
  local_90 = (pointer)((long)puVar9 -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (local_90 <
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      -(long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_60,(size_type)local_90);
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xf63;
    local_80._16_8_ = "GetByteData";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"set buffer size[{}]",
               (unsigned_long *)&local_90);
  }
LAB_004c0e6a:
  ByteData::ByteData(__return_storage_ptr__,&local_60);
  if ((uint32_t *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}